

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontAtlas::GlyphRangesBuilder::BuildRanges
          (GlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  bool bVar1;
  int iVar2;
  unsigned_short *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  do {
    bVar1 = GetBit(this,iVar5);
    iVar4 = iVar5;
    if (bVar1) {
      iVar4 = out_ranges->Size;
      if (iVar4 == out_ranges->Capacity) {
        if (iVar4 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar4 / 2 + iVar4;
        }
        iVar6 = iVar4 + 1;
        if (iVar4 + 1 < iVar2) {
          iVar6 = iVar2;
        }
        puVar3 = (unsigned_short *)ImGui::MemAlloc((long)iVar6 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar3,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar3;
        out_ranges->Capacity = iVar6;
        iVar4 = out_ranges->Size;
      }
      else {
        puVar3 = out_ranges->Data;
      }
      puVar3[iVar4] = (unsigned_short)iVar5;
      out_ranges->Size = out_ranges->Size + 1;
      do {
        iVar4 = iVar5;
        if (iVar4 == 0x10000) break;
        bVar1 = GetBit(this,iVar4 + 1);
        iVar5 = iVar4 + 1;
      } while (bVar1);
      iVar5 = out_ranges->Size;
      if (iVar5 == out_ranges->Capacity) {
        if (iVar5 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar5 / 2 + iVar5;
        }
        iVar6 = iVar5 + 1;
        if (iVar5 + 1 < iVar2) {
          iVar6 = iVar2;
        }
        puVar3 = (unsigned_short *)ImGui::MemAlloc((long)iVar6 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar3,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar3;
        out_ranges->Capacity = iVar6;
        iVar5 = out_ranges->Size;
      }
      else {
        puVar3 = out_ranges->Data;
      }
      puVar3[iVar5] = (unsigned_short)iVar4;
      out_ranges->Size = out_ranges->Size + 1;
    }
    iVar5 = iVar4 + 1;
    if (0xfffe < iVar4) {
      iVar5 = out_ranges->Size;
      if (iVar5 == out_ranges->Capacity) {
        if (iVar5 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar5 / 2 + iVar5;
        }
        iVar2 = iVar5 + 1;
        if (iVar5 + 1 < iVar4) {
          iVar2 = iVar4;
        }
        puVar3 = (unsigned_short *)ImGui::MemAlloc((long)iVar2 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar3,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar3;
        out_ranges->Capacity = iVar2;
        iVar5 = out_ranges->Size;
      }
      else {
        puVar3 = out_ranges->Data;
      }
      puVar3[iVar5] = 0;
      out_ranges->Size = out_ranges->Size + 1;
      return;
    }
  } while( true );
}

Assistant:

void ImFontAtlas::GlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    for (int n = 0; n < 0x10000; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < 0x10000 && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}